

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findfunction.cpp
# Opt level: O2

int node_width(string *name_node,datanode *node,string *type_name)

{
  __type _Var1;
  string *this;
  datanode *__lhs;
  long lVar2;
  string name_node_1;
  
  lVar2 = -1;
  do {
    __lhs = node;
    lVar2 = lVar2 + 1;
    if (nodepointer <= lVar2) {
      std::operator!=(name_node,"gtn");
      std::operator!=(name_node,"ltn");
      std::operator!=(name_node,"eqt");
      std::operator!=(name_node,"Clk");
      std::operator!=(name_node,"Rst");
      std::operator!=(name_node,"1");
      this = (string *)__cxa_allocate_exception(0x20);
      std::__cxx11::string::string(this,(string *)name_node);
      __cxa_throw(this,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
    _Var1 = std::operator==(&__lhs->name,name_node);
    node = __lhs + 1;
  } while (!_Var1);
  return __lhs->width;
}

Assistant:

int node_width(string name_node, struct datanode *node, string type_name)	//tyoe_namme is passed to just output it in case of error
 {
	 int l = 0;
		 for (int i = 0; i < nodepointer; i++)
		 {
			 if (node[i].name == name_node)
			 {
				 return node[i].width;
			 }
		 }
		 
		 if (name_node != "gtn" && name_node !="ltn" && name_node!="eqt" && name_node != "Clk" && name_node!="Rst" && name_node !="1") {
			 try {
				 throw (name_node);
			 }
			 catch (string name_node) {
				 cout << " Node : "<<name_node<<" Not Declared of type "<<type_name;
			 }
		 }
		  
		
 }